

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.hh
# Opt level: O2

string * __thiscall
tinyusdz::to_string<std::__cxx11::string>
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,uint32_t level)

{
  ostream *poVar1;
  uint32_t n;
  size_t i;
  ulong uVar2;
  long lVar3;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)v & 0xffffffff),n);
  poVar1 = std::operator<<(local_1a8,(string *)&local_1d8);
  std::operator<<(poVar1,"[");
  std::__cxx11::string::_M_dispose();
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5); uVar2 = uVar2 + 1) {
    to_string(&local_1d8,(string *)(*(long *)this + lVar3));
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::_M_dispose();
    if (uVar2 != (*(long *)(this + 8) - *(long *)this >> 5) - 1U) {
      std::operator<<(local_1a8,", ");
    }
    lVar3 = lVar3 + 0x20;
  }
  std::operator<<(local_1a8,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::vector<T> &v, const uint32_t level = 0) {
  std::stringstream ss;
  ss << pprint::Indent(level) << "[";

  // TODO(syoyo): indent for large array
  for (size_t i = 0; i < v.size(); i++) {
    ss << to_string(v[i]);
    if (i != (v.size() - 1)) {
      ss << ", ";
    }
  }
  ss << "]";
  return ss.str();
}